

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O3

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::filter_expression::evaluate
          (filter_expression *this,reference val,
          eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *context,error_code *ec)

{
  json_reference_storage jVar1;
  pointer phVar2;
  pointer ppeVar3;
  bool bVar4;
  int iVar5;
  reference pbVar6;
  pointer phVar7;
  undefined4 extraout_var;
  reference pbVar9;
  uint uVar10;
  iterator doc;
  expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  **expression;
  pointer ppeVar11;
  iterator iVar12;
  const_array_range_type cVar13;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> j;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  new_context;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
  local_a0;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *local_90;
  filter_expression *local_88;
  reference local_80;
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  *local_78;
  pointer local_70;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  local_68;
  iterator iVar8;
  
  pbVar6 = val;
  while (uVar10 = (byte)(pbVar6->field_0).json_ref_ & 0xf, uVar10 - 8 < 2) {
    pbVar6 = *(reference *)((long)&(pbVar6->field_0).byte_str_ + 8);
  }
  local_88 = this;
  if (uVar10 == 0xe) {
    local_90 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
               eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
               ::create_json<jsoncons::json_array_arg_t_const&>
                         ((eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                           *)context,(json_array_arg_t *)&json_array_arg);
    cVar13 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::array_range
                       (val);
    local_80 = (reference)cVar13.last_._M_current;
    if (cVar13.first_._M_current._M_current != local_80) {
      local_78 = &local_88->token_list_;
      do {
        iVar12 = cVar13.last_._M_current;
        doc = cVar13.first_._M_current;
        local_68.temp_storage_ = context->temp_storage_;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>_>_>
        ::_Rb_tree(&local_68.variables_._M_t,&(context->variables_)._M_t);
        phVar7 = (pointer)evaluate_tokens(doc._M_current,local_78,&local_68,ec);
        if (phVar7 == (pointer)0x0) {
          local_a0.common_ = (common_storage)0x0;
        }
        else {
          jVar1 = ((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
                    *)&phVar7->super_heap_string_base<jsoncons::null_type,_std::allocator<char>_>)->
                  json_ref_;
          phVar2 = phVar7;
          while (((byte)jVar1 & 0xe) == 8) {
            phVar2 = (pointer)phVar2->p_;
            jVar1 = ((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
                      *)&phVar2->super_heap_string_base<jsoncons::null_type,_std::allocator<char>_>)
                    ->json_ref_;
          }
          local_a0.common_.tag_ =
               (((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_5
                  *)&phVar2->super_heap_string_base<jsoncons::null_type,_std::allocator<char>_>)->
               common_).tag_;
          local_a0.json_ref_ = (json_reference_storage)8;
          local_a0.array_.ptr_ = (pointer)phVar7;
        }
        bVar4 = is_false((reference)&local_a0.common_);
        if (!bVar4) {
          ppeVar3 = (local_88->super_projection_base).expressions_.
                    super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          iVar8._M_current = doc._M_current;
          iVar12._M_current = local_80;
          for (ppeVar11 = (local_88->super_projection_base).expressions_.
                          super__Vector_base<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::allocator<jsoncons::jmespath::expr_base_impl<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              phVar7 = (pointer)iVar8._M_current, local_80 = iVar12._M_current, ppeVar11 != ppeVar3;
              ppeVar11 = ppeVar11 + 1) {
            iVar5 = (*((*ppeVar11)->
                      super_expr_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                      )._vptr_expr_base[2])(*ppeVar11,iVar8._M_current,context,ec);
            iVar8._M_current =
                 (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar5);
            iVar12._M_current = local_80;
          }
          while ((*(byte *)&phVar7->
                            super_heap_string_base<jsoncons::null_type,_std::allocator<char>_> & 0xf
                 ) - 8 < 2) {
            phVar7 = (pointer)phVar7->p_;
          }
          if ((*(byte *)&phVar7->super_heap_string_base<jsoncons::null_type,_std::allocator<char>_>
              & 0xf) != 0) {
            local_70 = (pointer)iVar8._M_current;
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const*>
                      (local_90,(json_const_pointer_arg_t *)&json_const_pointer_arg,
                       (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                        **)&local_70);
          }
        }
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   &local_a0.common_);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>_>_>
        ::~_Rb_tree(&local_68.variables_._M_t);
        cVar13.last_._M_current = iVar12._M_current;
        cVar13.first_._M_current = doc._M_current + 1;
      } while (doc._M_current + 1 != iVar12._M_current);
    }
    return (reference)local_90;
  }
  pbVar9 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar9;
}

Assistant:

reference evaluate(reference val, eval_context<Json>& context, std::error_code& ec) const override
            {
                if (!val.is_array())
                {
                    return context.null_value();
                }
                auto result = context.create_json(json_array_arg);

                for (auto& item : val.array_range())
                {
                    eval_context<Json> new_context{ context.temp_storage_, context.variables_ };
                    Json j(json_const_pointer_arg, evaluate_tokens(item, token_list_, new_context, ec));
                    if (is_true(j))
                    {
                        reference jj = this->apply_expressions(item, context, ec);
                        if (!jj.is_null())
                        {
                            result->emplace_back(json_const_pointer_arg, std::addressof(jj));
                        }
                    }
                }
                return *result;
            }